

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O0

extent idx2::Crop<idx2::extent,idx2::extent>(extent *Grid1,extent *Grid2)

{
  u64 uVar1;
  u64 uVar2;
  extent eVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool local_d81;
  int local_d80;
  int local_d78;
  int local_d70;
  int local_d6c;
  int local_d64;
  int local_d5c;
  int local_d28;
  int iStack_d24;
  int local_d18;
  int iStack_d14;
  undefined8 local_d0c;
  uint local_d04;
  int local_cc0;
  int iStack_cbc;
  int local_cb0;
  int iStack_cac;
  int local_ca0;
  int iStack_c9c;
  int local_c28;
  int iStack_c24;
  int local_c18;
  int iStack_c14;
  int local_c08;
  int iStack_c04;
  int local_bf8;
  int iStack_bf4;
  int local_be8;
  int iStack_be4;
  int local_ba4;
  int iStack_ba0;
  int local_b88;
  int iStack_b84;
  int local_b78;
  int iStack_b74;
  v3i Last3;
  int local_b44;
  int iStack_b40;
  uint local_b38;
  uint uStack_b34;
  v3i Frst3;
  int local_b18;
  int iStack_b14;
  v3i Grid1Frst3;
  int local_af8;
  int iStack_af4;
  v3i Strd3;
  extent *Grid2_local;
  extent *Grid1_local;
  extent OutGrid;
  int local_a94;
  int iStack_a90;
  int local_a64;
  int iStack_a60;
  int local_a34;
  int iStack_a30;
  int local_a04;
  int iStack_a00;
  int local_9d4;
  int iStack_9d0;
  int local_998;
  int iStack_994;
  int local_940;
  int iStack_93c;
  undefined8 local_8f4;
  int local_8c4;
  int iStack_8c0;
  int local_894;
  int iStack_890;
  int local_864;
  int iStack_860;
  int local_834;
  int iStack_830;
  int local_804;
  int iStack_800;
  int local_7d4;
  int iStack_7d0;
  int local_7a4;
  int iStack_7a0;
  int local_774;
  int iStack_770;
  int local_748;
  int iStack_744;
  int local_5a8;
  int iStack_5a4;
  int local_588;
  int iStack_584;
  int local_508;
  int iStack_504;
  int local_480;
  int iStack_47c;
  int local_460;
  int iStack_45c;
  int local_3e0;
  int iStack_3dc;
  int local_370;
  int iStack_36c;
  int local_338;
  int iStack_334;
  int local_300;
  int iStack_2fc;
  int local_2c8;
  int iStack_2c4;
  undefined4 local_280;
  undefined4 uStack_27c;
  int local_1e0;
  int iStack_1dc;
  int local_138;
  int iStack_134;
  int local_f8;
  int iStack_f4;
  int local_88;
  int iStack_84;
  
  local_280 = 1;
  uStack_27c = 1;
  uVar1 = Grid1->From;
  iVar5 = (int)((long)(uVar1 * 2) >> 0x2b);
  local_138 = ((int)uVar1 << 0xb) >> 0xb;
  iStack_134 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  uVar1 = Grid2->From;
  iVar4 = (int)((long)(uVar1 * 2) >> 0x2b);
  local_1e0 = ((int)uVar1 << 0xb) >> 0xb;
  iStack_1dc = (int)((long)(uVar1 << 0x16) >> 0x2b);
  local_b18 = (int)_local_138;
  local_b44 = (int)_local_1e0;
  if (local_b18 < local_b44) {
    local_d5c = local_b44;
  }
  else {
    local_d5c = local_b18;
  }
  iStack_b14 = (int)((ulong)_local_138 >> 0x20);
  iStack_b40 = (int)((ulong)_local_1e0 >> 0x20);
  if (iStack_b14 < iStack_b40) {
    local_d64 = iStack_b40;
  }
  else {
    local_d64 = iStack_b14;
  }
  local_d6c = iVar5;
  if (iVar5 < iVar4) {
    local_d6c = iVar4;
  }
  local_f8 = local_d5c;
  iStack_f4 = local_d64;
  uVar1 = Grid1->From;
  local_2c8 = ((int)uVar1 << 0xb) >> 0xb;
  iStack_2c4 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  uVar2 = Grid1->Dims;
  local_300 = ((int)uVar2 << 0xb) >> 0xb;
  iStack_2fc = (int)((long)(uVar2 << 0x16) >> 0x2b);
  local_588 = (int)_local_2c8;
  iStack_584 = (int)((ulong)_local_2c8 >> 0x20);
  local_5a8 = (int)_local_300;
  iStack_5a4 = (int)((ulong)_local_300 >> 0x20);
  local_508 = local_588 + local_5a8;
  iStack_504 = iStack_584 + iStack_5a4;
  local_940 = (int)_local_508;
  iStack_93c = (int)((ulong)_local_508 >> 0x20);
  local_d80 = (int)((long)(uVar1 * 2) >> 0x2b) + (int)((long)(uVar2 * 2) >> 0x2b) + -1;
  local_834 = local_940 + -1;
  iStack_830 = iStack_93c + -1;
  uVar1 = Grid2->From;
  local_338 = ((int)uVar1 << 0xb) >> 0xb;
  iStack_334 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  uVar2 = Grid2->Dims;
  local_370 = ((int)uVar2 << 0xb) >> 0xb;
  iStack_36c = (int)((long)(uVar2 << 0x16) >> 0x2b);
  local_460 = (int)_local_338;
  iStack_45c = (int)((ulong)_local_338 >> 0x20);
  local_480 = (int)_local_370;
  iStack_47c = (int)((ulong)_local_370 >> 0x20);
  local_3e0 = local_460 + local_480;
  iStack_3dc = iStack_45c + iStack_47c;
  local_998 = (int)_local_3e0;
  iStack_994 = (int)((ulong)_local_3e0 >> 0x20);
  iVar4 = (int)((long)(uVar1 * 2) >> 0x2b) + (int)((long)(uVar2 * 2) >> 0x2b) + -1;
  local_804 = local_998 + -1;
  iStack_800 = iStack_994 + -1;
  local_ba4 = (int)_local_804;
  local_b88 = (int)_local_834;
  if (local_ba4 < local_b88) {
    local_d70 = local_ba4;
  }
  else {
    local_d70 = local_b88;
  }
  iStack_ba0 = (int)((ulong)_local_804 >> 0x20);
  iStack_b84 = (int)((ulong)_local_834 >> 0x20);
  if (iStack_ba0 < iStack_b84) {
    local_d78 = iStack_ba0;
  }
  else {
    local_d78 = iStack_b84;
  }
  if (iVar4 < local_d80) {
    local_d80 = iVar4;
  }
  local_88 = local_d70;
  iStack_84 = local_d78;
  local_b38 = (uint)_local_f8;
  uStack_b34 = (uint)((ulong)_local_f8 >> 0x20);
  local_864 = local_b38 - local_b18;
  iStack_860 = uStack_b34 - iStack_b14;
  local_c28 = (int)_local_864;
  iStack_c24 = (int)((ulong)_local_864 >> 0x20);
  local_af8 = (int)_local_280;
  iStack_af4 = (int)((ulong)_local_280 >> 0x20);
  local_748 = local_c28 + local_af8;
  iStack_744 = iStack_c24 + iStack_af4;
  local_c18 = (int)_local_748;
  iStack_c14 = (int)((ulong)_local_748 >> 0x20);
  local_7d4 = local_c18 + -1;
  iStack_7d0 = iStack_c14 + -1;
  local_c08 = (int)_local_7d4;
  iStack_c04 = (int)((ulong)_local_7d4 >> 0x20);
  local_9d4 = local_c08 / local_af8;
  iStack_9d0 = iStack_c04 / iStack_af4;
  local_bf8 = (int)_local_9d4;
  iStack_bf4 = (int)((ulong)_local_9d4 >> 0x20);
  local_a64 = local_bf8 * local_af8;
  iStack_a60 = iStack_bf4 * iStack_af4;
  local_be8 = (int)_local_a64;
  iStack_be4 = (int)((ulong)_local_a64 >> 0x20);
  uVar6 = (local_d6c - iVar5) / 1 + iVar5;
  local_774 = local_be8 + local_b18;
  iStack_770 = iStack_be4 + iStack_b14;
  local_b78 = (int)_local_88;
  iStack_b74 = (int)((ulong)_local_88 >> 0x20);
  local_894 = local_b78 - local_b18;
  iStack_890 = iStack_b74 - iStack_b14;
  local_cc0 = (int)_local_894;
  iStack_cbc = (int)((ulong)_local_894 >> 0x20);
  local_a04 = local_cc0 / local_af8;
  iStack_a00 = iStack_cbc / iStack_af4;
  local_cb0 = (int)_local_a04;
  iStack_cac = (int)((ulong)_local_a04 >> 0x20);
  local_a94 = local_cb0 * local_af8;
  iStack_a90 = iStack_cac * iStack_af4;
  local_ca0 = (int)_local_a94;
  iStack_c9c = (int)((ulong)_local_a94 >> 0x20);
  iVar5 = (local_d80 - iVar5) / 1 + iVar5;
  local_7a4 = local_ca0 + local_b18;
  iStack_7a0 = iStack_c9c + iStack_b14;
  local_b38 = (uint)_local_774;
  uStack_b34 = (uint)((ulong)_local_774 >> 0x20);
  local_b78 = (int)_local_7a4;
  local_d81 = false;
  iStack_b74 = (int)((ulong)_local_7a4 >> 0x20);
  if (((int)local_b38 <= local_b78) && (local_d81 = false, (int)uStack_b34 <= iStack_b74)) {
    local_d81 = (int)uVar6 <= iVar5;
  }
  if (local_d81) {
    local_8c4 = local_b78 - local_b38;
    iStack_8c0 = iStack_b74 - uStack_b34;
    local_d28 = (int)_local_8c4;
    iStack_d24 = (int)((ulong)_local_8c4 >> 0x20);
    local_a34 = local_d28 / local_af8;
    iStack_a30 = iStack_d24 / iStack_af4;
    local_d18 = (int)_local_a34;
    iStack_d14 = (int)((ulong)_local_a34 >> 0x20);
    local_d04 = (int)(iVar5 - uVar6) / 1 + 1;
    local_8f4._0_4_ = local_d18 + 1;
    local_8f4._4_4_ = iStack_d14 + 1;
    local_d0c = local_8f4;
  }
  else {
    local_d0c._0_4_ = 0;
    local_d0c._4_4_ = 0;
    local_d04 = 0;
  }
  eVar3.Dims = (ulong)((uint)local_d0c & 0x1fffff) | (ulong)(local_d0c._4_4_ & 0x1fffff) << 0x15 |
               (ulong)(local_d04 & 0x1fffff) << 0x2a;
  eVar3.From = (long)(int)(local_b38 & 0x1fffff) + (long)(int)(uStack_b34 & 0x1fffff) * 0x200000 +
               ((long)(int)(uVar6 & 0x1fffff) << 0x2a);
  return eVar3;
}

Assistant:

t1
Crop(const t1& Grid1, const t2& Grid2)
{
  v3i Strd3 = Strd(Grid1);
  v3i Grid1Frst3 = Frst(Grid1);
  v3i Frst3 = Max(Grid1Frst3, Frst(Grid2));
  v3i Last3 = Min(Last(Grid1), Last(Grid2));
  Frst3 = ((Frst3 - Grid1Frst3 + Strd3 - 1) / Strd3) * Strd3 + Grid1Frst3;
  Last3 = ((Last3 - Grid1Frst3) / Strd3) * Strd3 + Grid1Frst3;
  t1 OutGrid = Grid1;
  SetFrom(&OutGrid, Frst3);
  SetDims(&OutGrid, Frst3 <= Last3 ? (Last3 - Frst3) / Strd3 + 1 : v3i(0));
  return OutGrid;
}